

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_joinref.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::Binder::CreatePlan(Binder *this,BoundJoinRef *ref)

{
  pointer *this_00;
  undefined1 uVar1;
  LogicalOperatorType LVar2;
  _Head_base<0UL,_duckdb::SampleOptions_*,_false> context;
  _func_int **pp_Var3;
  pointer puVar4;
  pointer puVar5;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar6;
  undefined8 uVar7;
  bool bVar8;
  int iVar9;
  type pLVar10;
  ClientConfig *pCVar11;
  pointer pEVar12;
  pointer pLVar13;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var14;
  LogicalOperator *pLVar15;
  LogicalFilter *pLVar16;
  reference pvVar17;
  reference pvVar18;
  type expression_00;
  pointer pLVar19;
  LogicalAnyJoin *pLVar20;
  NotImplementedException *this_01;
  JoinRefType reftype;
  long in_RDX;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expression;
  pointer this_02;
  ulong __n;
  pointer puVar21;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> condition;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar22;
  undefined1 local_e0 [16];
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_d0;
  optional_ptr<duckdb::LogicalOperator,_true> join;
  allocator local_b9;
  __node_base local_b8;
  __node_base local_b0;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_a8;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_a0;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_98;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_90;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_88;
  __node_base local_80;
  __node_base local_78;
  long *local_70;
  undefined1 local_68 [16];
  RecursiveDependentJoinPlanner plan;
  long *local_38;
  
  uVar1 = *(undefined1 *)
           ((long)&ref[3].correlated_columns.
                   super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                   .
                   super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1);
  if (*(char *)(in_RDX + 0x6b) == '\x01') {
    *(undefined1 *)
     ((long)&ref[3].correlated_columns.
             super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
             .
             super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
             ._M_impl.super__Vector_impl_data._M_start + 1) = 0;
  }
  local_d0._M_head_impl = (LogicalOperator *)this;
  unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::operator*
            ((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> *)
             (in_RDX + 0x38));
  CreatePlan((Binder *)(local_e0 + 8),&ref->super_BoundTableRef);
  unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::operator*
            ((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> *)
             (in_RDX + 0x40));
  CreatePlan((Binder *)local_e0,&ref->super_BoundTableRef);
  *(undefined1 *)
   ((long)&ref[3].correlated_columns.
           super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
           .
           super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
           ._M_impl.super__Vector_impl_data._M_start + 1) = uVar1;
  if ((*(char *)(in_RDX + 0x6b) == '\0') && (*(long *)(in_RDX + 0x70) != *(long *)(in_RDX + 0x78)))
  {
    pLVar10 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator*((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)local_e0);
    LateralBinder::ReduceExpressionDepth
              (pLVar10,(vector<duckdb::CorrelatedColumnInfo,_true> *)(in_RDX + 0x70));
  }
  if ((*(char *)(in_RDX + 0x69) == '\x02') && (*(char *)(in_RDX + 0x6a) != '\x04')) {
    pCVar11 = ClientConfig::GetConfig
                        ((ClientContext *)
                         (ref->super_BoundTableRef).sample.
                         super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>
                         ._M_t.
                         super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>
                         .super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl);
    if (pCVar11->enable_optimizer == true) {
      bVar8 = Optimizer::OptimizerDisabled
                        ((ClientContext *)
                         (ref->super_BoundTableRef).sample.
                         super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>
                         ._M_t.
                         super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>
                         .super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl,
                         BUILD_SIDE_PROBE_SIDE);
      if (!bVar8) {
        *(undefined1 *)(in_RDX + 0x69) = 1;
        ::std::
        swap<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                  ((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)(local_e0 + 8),
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)local_e0);
      }
    }
  }
  uVar7 = local_e0._8_8_;
  if (*(char *)(in_RDX + 0x6b) == '\x01') {
    local_e0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_68._8_8_ = uVar7;
    local_68._0_8_ = local_e0._0_8_;
    local_e0._0_8_ =
         (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
          )0x0;
    condition.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl._1_7_ = 0;
    condition.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl._0_1_ = *(byte *)(in_RDX + 0x69)
    ;
    local_70 = *(long **)(in_RDX + 0x48);
    *(undefined8 *)(in_RDX + 0x48) = 0;
    PlanLateralJoin((Binder *)local_d0._M_head_impl,
                    (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                     *)ref,(unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                            *)(local_68 + 8),(vector<duckdb::CorrelatedColumnInfo,_true> *)local_68,
                    (char)in_RDX + 0x70,condition);
    if (local_70 != (long *)0x0) {
      (**(code **)(*local_70 + 8))();
    }
    local_70 = (long *)0x0;
    if ((element_type *)local_68._0_8_ != (element_type *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_68._0_8_)->__weak_this_).
                  internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    local_68._0_8_ = (pointer)0x0;
    if ((pointer)local_68._8_8_ != (pointer)0x0) {
      (*((_func_int **)((ColumnBinding *)local_68._8_8_)->table_index)[1])();
    }
    local_68._8_8_ = (pointer)0x0;
    if (*(char *)&ref[3].correlated_columns.
                  super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                  .
                  super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start == '\x01') {
      plan.super_LogicalOperatorVisitor._vptr_LogicalOperatorVisitor =
           (_func_int **)&PTR__RecursiveDependentJoinPlanner_017af228;
      plan.root.
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
            )0x0;
      plan.binder = (Binder *)ref;
      pLVar10 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator*((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                             *)local_d0._M_head_impl);
      RecursiveDependentJoinPlanner::VisitOperator(&plan,pLVar10);
      RecursiveDependentJoinPlanner::~RecursiveDependentJoinPlanner(&plan);
    }
    goto LAB_00608e86;
  }
  reftype = *(JoinRefType *)(in_RDX + 0x6a);
  if (reftype == POSITIONAL) {
    local_e0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_88._M_head_impl = (LogicalOperator *)uVar7;
    local_90._M_head_impl = (LogicalOperator *)local_e0._0_8_;
    local_e0._0_8_ =
         (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
          )0x0;
    LogicalPositionalJoin::Create
              ((LogicalPositionalJoin *)local_d0._M_head_impl,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_88,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_90);
    if ((element_type *)local_90._M_head_impl != (element_type *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)
                   &(local_90._M_head_impl)->_vptr_LogicalOperator)->__weak_this_).internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    local_90._M_head_impl = (LogicalOperator *)0x0;
    if (local_88._M_head_impl != (LogicalOperator *)0x0) {
      (*(local_88._M_head_impl)->_vptr_LogicalOperator[1])();
    }
    local_88._M_head_impl = (LogicalOperator *)0x0;
    goto LAB_00608e86;
  }
  if (reftype == CROSS) {
    local_e0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_78._M_nxt = (_Hash_node_base *)uVar7;
    local_80._M_nxt = (_Hash_node_base *)local_e0._0_8_;
    local_e0._0_8_ =
         (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
          )0x0;
    LogicalCrossProduct::Create
              ((LogicalCrossProduct *)local_d0._M_head_impl,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_78,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_80);
    if ((element_type *)local_80._M_nxt != (element_type *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)&(local_80._M_nxt)->_M_nxt)->
                  __weak_this_).internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    local_80._M_nxt = (_Hash_node_base *)0x0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_nxt !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (*(code *)(local_78._M_nxt)->_M_nxt[1]._M_nxt)();
    }
    local_78._M_nxt = (_Hash_node_base *)0x0;
    goto LAB_00608e86;
  }
  if (*(char *)(in_RDX + 0x69) == '\x03') {
    puVar22 = (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
              (in_RDX + 0x48);
    pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(puVar22);
    iVar9 = (*(pEVar12->super_BaseExpression)._vptr_BaseExpression[4])(pEVar12);
    if ((char)iVar9 == '\0') {
      expression_00 =
           unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (puVar22);
      bVar8 = HasCorrelatedColumns(expression_00);
      reftype = *(JoinRefType *)(in_RDX + 0x6a);
      if (bVar8 && reftype == REGULAR) goto LAB_00608cc7;
    }
    else {
      reftype = *(JoinRefType *)(in_RDX + 0x6a);
      if (reftype == REGULAR) {
LAB_00608cc7:
        local_98._M_head_impl = (LogicalOperator *)local_e0._8_8_;
        local_e0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_a0._M_head_impl = (LogicalOperator *)local_e0._0_8_;
        local_e0._0_8_ =
             (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
              )0x0;
        LogicalCrossProduct::Create
                  ((LogicalCrossProduct *)&plan,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)&local_98,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)&local_a0);
        if ((element_type *)local_a0._M_head_impl != (element_type *)0x0) {
          (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)
                       &(local_a0._M_head_impl)->_vptr_LogicalOperator)->__weak_this_).internal.
                      super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                    ();
        }
        local_a0._M_head_impl = (LogicalOperator *)0x0;
        if (local_98._M_head_impl != (LogicalOperator *)0x0) {
          (*(local_98._M_head_impl)->_vptr_LogicalOperator[1])();
        }
        local_98._M_head_impl = (LogicalOperator *)0x0;
        make_uniq<duckdb::LogicalFilter,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((duckdb *)&join,puVar22);
        pLVar19 = unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                                *)&join);
        puVar5 = (pLVar19->super_LogicalOperator).expressions.
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (puVar21 = (pLVar19->super_LogicalOperator).expressions.
                       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; puVar21 != puVar5;
            puVar21 = puVar21 + 1) {
          PlanSubqueries((Binder *)ref,puVar21,
                         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                          *)&plan);
        }
        pLVar19 = unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                  ::operator->((unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                                *)&join);
        local_a8._M_head_impl =
             (LogicalOperator *)plan.super_LogicalOperatorVisitor._vptr_LogicalOperatorVisitor;
        plan.super_LogicalOperatorVisitor._vptr_LogicalOperatorVisitor = (_func_int **)0x0;
        LogicalOperator::AddChild
                  (&pLVar19->super_LogicalOperator,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)&local_a8);
        if (local_a8._M_head_impl != (LogicalOperator *)0x0) {
          (*(local_a8._M_head_impl)->_vptr_LogicalOperator[1])();
        }
        local_a8._M_head_impl = (LogicalOperator *)0x0;
        (local_d0._M_head_impl)->_vptr_LogicalOperator = (_func_int **)join.ptr;
        if (plan.super_LogicalOperatorVisitor._vptr_LogicalOperatorVisitor != (_func_int **)0x0) {
          (**(code **)(*plan.super_LogicalOperatorVisitor._vptr_LogicalOperatorVisitor + 8))();
        }
        goto LAB_00608e86;
      }
    }
  }
  local_b8._M_nxt = (_Hash_node_base *)local_e0._0_8_;
  context._M_head_impl =
       (ref->super_BoundTableRef).sample.
       super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
       super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>.
       super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl;
  local_b0._M_nxt = (_Hash_node_base *)local_e0._8_8_;
  local_e0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_e0._0_8_ =
       (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
        )0x0;
  local_38 = *(long **)(in_RDX + 0x48);
  *(undefined8 *)(in_RDX + 0x48) = 0;
  LogicalComparisonJoin::CreateJoin
            ((LogicalComparisonJoin *)local_d0._M_head_impl,(ClientContext *)context._M_head_impl,
             *(JoinType *)(in_RDX + 0x69),reftype,
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)&local_b0,
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)&local_b8,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>)
             &local_38);
  if (local_38 != (long *)0x0) {
    (**(code **)(*local_38 + 8))();
  }
  if ((element_type *)local_b8._M_nxt != (element_type *)0x0) {
    (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)&(local_b8._M_nxt)->_M_nxt)->
                __weak_this_).internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
              super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
  }
  local_b8._M_nxt = (_Hash_node_base *)0x0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._M_nxt !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*(code *)(local_b0._M_nxt)->_M_nxt[1]._M_nxt)();
  }
  local_b0._M_nxt = (_Hash_node_base *)0x0;
  join.ptr = (LogicalOperator *)0x0;
  pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                          *)local_d0._M_head_impl);
  _Var14._M_head_impl = local_d0._M_head_impl;
  if (pLVar13->type == LOGICAL_FILTER) {
    pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                            *)local_d0._M_head_impl);
    _Var14._M_head_impl =
         (LogicalOperator *)
         vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
         ::get<true>(&pLVar13->children,0);
  }
  join.ptr = (((_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                *)&(((Binder *)_Var14._M_head_impl)->super_enable_shared_from_this<duckdb::Binder>).
                   __weak_this_.internal.
                   super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>)._M_head_impl;
  if (*(char *)(in_RDX + 0x69) == '\a') {
    pp_Var3 = *(_func_int ***)(in_RDX + 0x88);
    pLVar15 = optional_ptr<duckdb::LogicalOperator,_true>::operator->(&join);
    pLVar15[1]._vptr_LogicalOperator = pp_Var3;
  }
  pLVar15 = optional_ptr<duckdb::LogicalOperator,_true>::operator->(&join);
  puVar4 = (pLVar15->children).
           super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_02 = (pLVar15->children).
                 super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_02 != puVar4; this_02 = this_02 + 1
      ) {
    pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator->(this_02);
    if (pLVar13->type == LOGICAL_FILTER) {
      pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->(this_02);
      pLVar16 = LogicalOperator::Cast<duckdb::LogicalFilter>(pLVar13);
      puVar5 = (pLVar16->super_LogicalOperator).expressions.
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar21 = (pLVar16->super_LogicalOperator).expressions.
                     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar21 != puVar5;
          puVar21 = puVar21 + 1) {
        pvVar17 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                  ::get<true>(&(pLVar16->super_LogicalOperator).children,0);
        PlanSubqueries((Binder *)ref,puVar21,pvVar17);
      }
    }
  }
  pLVar15 = optional_ptr<duckdb::LogicalOperator,_true>::operator->(&join);
  LVar2 = pLVar15->type;
  if (LVar2 == LOGICAL_ASOF_JOIN) {
LAB_00608c0d:
    pLVar15 = optional_ptr<duckdb::LogicalOperator,_true>::operator->(&join);
    this_00 = &pLVar15[1].types.
               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage;
    for (__n = 0; __n < (ulong)((long)(pLVar15[1].estimated_cardinality -
                                      (long)pLVar15[1].types.
                                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                            .
                                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage) /
                               0x18); __n = __n + 1) {
      pvVar18 = vector<duckdb::JoinCondition,_true>::get<true>
                          ((vector<duckdb::JoinCondition,_true> *)this_00,__n);
      pvVar17 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                ::get<true>(&pLVar15->children,0);
      PlanSubqueries((Binder *)ref,&pvVar18->left,pvVar17);
      pvVar18 = vector<duckdb::JoinCondition,_true>::get<true>
                          ((vector<duckdb::JoinCondition,_true> *)this_00,__n);
      pvVar17 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                ::get<true>(&pLVar15->children,1);
      PlanSubqueries((Binder *)ref,&pvVar18->right,pvVar17);
    }
  }
  else if (LVar2 == LOGICAL_ANY_JOIN) {
    pLVar15 = optional_ptr<duckdb::LogicalOperator,_true>::operator->(&join);
    pLVar20 = LogicalOperator::Cast<duckdb::LogicalAnyJoin>(pLVar15);
    pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(&pLVar20->condition);
    iVar9 = (*(pEVar12->super_BaseExpression)._vptr_BaseExpression[4])(pEVar12);
    if ((char)iVar9 != '\0') {
      this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&plan,"Cannot perform non-inner join on subquery!",&local_b9);
      NotImplementedException::NotImplementedException(this_01,(string *)&plan);
      __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else if (LVar2 == LOGICAL_COMPARISON_JOIN) goto LAB_00608c0d;
  if (*(long *)(in_RDX + 0x50) != *(long *)(in_RDX + 0x58)) {
    pLVar15 = optional_ptr<duckdb::LogicalOperator,_true>::operator->(&join);
    pLVar15->type = LOGICAL_DELIM_JOIN;
    *(undefined1 *)
     &pLVar15[2].expressions.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = *(undefined1 *)(in_RDX + 0x68);
    puVar6 = *(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> **)
              (in_RDX + 0x58);
    for (puVar22 = *(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                     **)(in_RDX + 0x50); puVar22 != puVar6; puVar22 = puVar22 + 1) {
      pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(puVar22);
      (*(pEVar12->super_BaseExpression)._vptr_BaseExpression[0x11])(&plan,pEVar12);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&pLVar15[2].children.
                     super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &plan);
      if (plan.super_LogicalOperatorVisitor._vptr_LogicalOperatorVisitor != (_func_int **)0x0) {
        (**(code **)(*plan.super_LogicalOperatorVisitor._vptr_LogicalOperatorVisitor + 8))();
      }
    }
  }
LAB_00608e86:
  if ((LogicalOperator *)local_e0._0_8_ != (LogicalOperator *)0x0) {
    (**(code **)(*(long *)local_e0._0_8_ + 8))();
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*(*(_func_int ***)local_e0._8_8_)[1])();
  }
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         )local_d0._M_head_impl;
}

Assistant:

unique_ptr<LogicalOperator> Binder::CreatePlan(BoundJoinRef &ref) {
	auto old_is_outside_flattened = is_outside_flattened;
	// Plan laterals from outermost to innermost
	if (ref.lateral) {
		// Set the flag to ensure that children do not flatten before the root
		is_outside_flattened = false;
	}
	auto left = CreatePlan(*ref.left);
	auto right = CreatePlan(*ref.right);
	is_outside_flattened = old_is_outside_flattened;

	// For joins, depth of the bindings will be one higher on the right because of the lateral binder
	// If the current join does not have correlations between left and right, then the right bindings
	// have depth 1 too high and can be reduced by 1 throughout
	if (!ref.lateral && !ref.correlated_columns.empty()) {
		LateralBinder::ReduceExpressionDepth(*right, ref.correlated_columns);
	}

	if (ref.type == JoinType::RIGHT && ref.ref_type != JoinRefType::ASOF &&
	    ClientConfig::GetConfig(context).enable_optimizer &&
	    !Optimizer::OptimizerDisabled(context, OptimizerType::BUILD_SIDE_PROBE_SIDE)) {
		// we turn any right outer joins into left outer joins for optimization purposes
		// they are the same but with sides flipped, so treating them the same simplifies life
		ref.type = JoinType::LEFT;
		std::swap(left, right);
	}
	if (ref.lateral) {
		auto new_plan = PlanLateralJoin(std::move(left), std::move(right), ref.correlated_columns, ref.type,
		                                std::move(ref.condition));
		if (has_unplanned_dependent_joins) {
			RecursiveDependentJoinPlanner plan(*this);
			plan.VisitOperator(*new_plan);
		}
		return new_plan;
	}
	switch (ref.ref_type) {
	case JoinRefType::CROSS:
		return LogicalCrossProduct::Create(std::move(left), std::move(right));
	case JoinRefType::POSITIONAL:
		return LogicalPositionalJoin::Create(std::move(left), std::move(right));
	default:
		break;
	}
	if (ref.type == JoinType::INNER && (ref.condition->HasSubquery() || HasCorrelatedColumns(*ref.condition)) &&
	    ref.ref_type == JoinRefType::REGULAR) {
		// inner join, generate a cross product + filter
		// this will be later turned into a proper join by the join order optimizer
		auto root = LogicalCrossProduct::Create(std::move(left), std::move(right));

		auto filter = make_uniq<LogicalFilter>(std::move(ref.condition));
		// visit the expressions in the filter
		for (auto &expression : filter->expressions) {
			PlanSubqueries(expression, root);
		}
		filter->AddChild(std::move(root));
		return std::move(filter);
	}

	// now create the join operator from the join condition
	auto result = LogicalComparisonJoin::CreateJoin(context, ref.type, ref.ref_type, std::move(left), std::move(right),
	                                                std::move(ref.condition));
	optional_ptr<LogicalOperator> join;
	if (result->type == LogicalOperatorType::LOGICAL_FILTER) {
		join = result->children[0].get();
	} else {
		join = result.get();
	}

	if (ref.type == JoinType::MARK) {
		join->Cast<LogicalJoin>().mark_index = ref.mark_index;
	}
	for (auto &child : join->children) {
		if (child->type == LogicalOperatorType::LOGICAL_FILTER) {
			auto &filter = child->Cast<LogicalFilter>();
			for (auto &expr : filter.expressions) {
				PlanSubqueries(expr, filter.children[0]);
			}
		}
	}

	// we visit the expressions depending on the type of join
	switch (join->type) {
	case LogicalOperatorType::LOGICAL_ASOF_JOIN:
	case LogicalOperatorType::LOGICAL_COMPARISON_JOIN: {
		// comparison join
		// in this join we visit the expressions on the LHS with the LHS as root node
		// and the expressions on the RHS with the RHS as root node
		auto &comp_join = join->Cast<LogicalComparisonJoin>();
		for (idx_t i = 0; i < comp_join.conditions.size(); i++) {
			PlanSubqueries(comp_join.conditions[i].left, comp_join.children[0]);
			PlanSubqueries(comp_join.conditions[i].right, comp_join.children[1]);
		}
		break;
	}
	case LogicalOperatorType::LOGICAL_ANY_JOIN: {
		auto &any_join = join->Cast<LogicalAnyJoin>();
		// for the any join we just visit the condition
		if (any_join.condition->HasSubquery()) {
			throw NotImplementedException("Cannot perform non-inner join on subquery!");
		}
		break;
	}
	default:
		break;
	}
	if (!ref.duplicate_eliminated_columns.empty()) {
		auto &comp_join = join->Cast<LogicalComparisonJoin>();
		comp_join.type = LogicalOperatorType::LOGICAL_DELIM_JOIN;
		comp_join.delim_flipped = ref.delim_flipped;
		for (auto &col : ref.duplicate_eliminated_columns) {
			comp_join.duplicate_eliminated_columns.emplace_back(col->Copy());
		}
	}
	return result;
}